

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O1

ByteString * DERUTIL::octet2Raw(ByteString *__return_storage_ptr__,ByteString *byteString)

{
  byte bVar1;
  size_t sVar2;
  uchar *puVar3;
  byte *pbVar4;
  size_t sVar5;
  unsigned_long uVar6;
  int lineNo;
  char *pcVar7;
  ulong uVar8;
  ulong start;
  ByteString repr;
  ByteString length;
  ByteString rv;
  ByteString local_98;
  ByteString local_70;
  ByteString local_48;
  
  ByteString::ByteString(&local_48);
  ByteString::ByteString(&local_98,byteString);
  sVar2 = ByteString::size(&local_98);
  if (sVar2 < 2) {
    pcVar7 = "Undersized octet string";
    lineNo = 0x54;
  }
  else {
    puVar3 = ByteString::operator[](&local_98,0);
    if (*puVar3 == '\x04') {
      puVar3 = ByteString::operator[](&local_98,1);
      if ((char)*puVar3 < '\0') {
        pbVar4 = ByteString::operator[](&local_98,1);
        bVar1 = *pbVar4;
        sVar5 = ByteString::size(&local_98);
        start = (ulong)(bVar1 & 0x7f) + 2;
        if (sVar5 <= start) {
          softHSMLog(3,"octet2Raw",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                     ,0x79,"Undersized octet string");
          ByteString::ByteString(__return_storage_ptr__,&local_48);
          goto LAB_0014e297;
        }
        puVar3 = ByteString::operator[](&local_98,2);
        ByteString::ByteString(&local_70,puVar3,(ulong)(bVar1 & 0x7f));
        uVar6 = ByteString::long_val(&local_70);
        uVar8 = sVar2 - start;
        if (uVar6 != uVar8) {
          uVar6 = ByteString::long_val(&local_70);
          pcVar7 = "Overrun octet string";
          if (uVar8 > uVar6) {
            pcVar7 = "Underrun octet string";
          }
          softHSMLog(3,"octet2Raw",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                     ,(uint)(uVar8 <= uVar6) * 4 + 0x84,pcVar7);
          ByteString::ByteString(__return_storage_ptr__,&local_48);
          local_70._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_70.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          goto LAB_0014e297;
        }
        local_70._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_70.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
      else {
        pbVar4 = ByteString::operator[](&local_98,1);
        uVar8 = sVar2 - 2;
        start = 2;
        if (uVar8 != *pbVar4) {
          pbVar4 = ByteString::operator[](&local_98,1);
          lineNo = (uint)(uVar8 <= *pbVar4) * 4 + 0x67;
          pcVar7 = "Overrun octet string";
          if (*pbVar4 < uVar8) {
            pcVar7 = "Underrun octet string";
          }
          goto LAB_0014e270;
        }
      }
      ByteString::substr(__return_storage_ptr__,&local_98,start,sVar2 - start);
      goto LAB_0014e297;
    }
    pcVar7 = "ByteString is not an octet string";
    lineNo = 0x5b;
  }
LAB_0014e270:
  softHSMLog(3,"octet2Raw",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
             ,lineNo,pcVar7);
  ByteString::ByteString(__return_storage_ptr__,&local_48);
LAB_0014e297:
  local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_98.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_48.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString DERUTIL::octet2Raw(const ByteString& byteString)
{
	ByteString rv;
	ByteString repr = byteString;
	size_t len = repr.size();
	size_t controlOctets = 2;

	if (len < controlOctets)
	{
		ERROR_MSG("Undersized octet string");

		return rv;
	}

	if (repr[0] != 0x04)
	{
		ERROR_MSG("ByteString is not an octet string");

		return rv;
	}

	// Definite, short
	if (repr[1] < 0x80)
	{
		if (repr[1] != (len - controlOctets))
		{
			if (repr[1] < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}
	// Definite, long
	else
	{
		size_t lengthOctets = repr[1] & 0x7f;
		controlOctets += lengthOctets;

		if (controlOctets >= repr.size())
		{
			ERROR_MSG("Undersized octet string");

			return rv;
		}

		ByteString length(&repr[2], lengthOctets);

		if (length.long_val() != (len - controlOctets))
                {
			if (length.long_val() < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}

	return repr.substr(controlOctets, len - controlOctets);
}